

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Parser.h
# Opt level: O3

bool __thiscall Assimp::MD5::MD5Parser::SkipSpacesAndLineEnd(MD5Parser *this,char *in,char **out)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  bool bVar4;
  
  uVar3 = this->lineNumber;
  bVar4 = false;
  do {
    bVar1 = *in;
    if (bVar1 < 0xd) {
      bVar2 = false;
      if (bVar1 != 9) {
        if (bVar1 != 10) goto LAB_004564ff;
LAB_004564ea:
        bVar2 = true;
        if (!bVar4) {
          uVar3 = uVar3 + 1;
          this->lineNumber = uVar3;
        }
      }
    }
    else {
      bVar2 = false;
      if (bVar1 != 0x20) {
        if (bVar1 == 0xd) goto LAB_004564ea;
LAB_004564ff:
        *out = in;
        return *in != 0;
      }
    }
    bVar4 = bVar2;
    in = (char *)((byte *)in + 1);
  } while( true );
}

Assistant:

bool SkipSpacesAndLineEnd( const char* in, const char** out)
    {
        bool bHad = false;
        bool running = true;
        while (running) {
            if( *in == '\r' || *in == '\n') {
                 // we open files in binary mode, so there could be \r\n sequences ...
                if (!bHad)  {
                    bHad = true;
                    ++lineNumber;
                }
            }
            else if (*in == '\t' || *in == ' ')bHad = false;
            else break;
            in++;
        }
        *out = in;
        return *in != '\0';
    }